

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmtr.c
# Opt level: O2

pid_t dep_monitor(char *file)

{
  job_t *pjVar1;
  undefined8 uVar2;
  __pid_t _Var3;
  int iVar4;
  int iVar5;
  int *piVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  job_t *job;
  sigset_t hup;
  
  _Var3 = fork();
  if (_Var3 == -1) {
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    syslog(3,"fork: %s\n",pcVar7);
  }
  else if (_Var3 < 1) {
    prctl(0xf,"pmtr-dep");
    close_sockets(&cfg);
    iVar4 = inotify_init();
    if (iVar4 == -1) {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      syslog(3,"inotify_init: %s",pcVar7);
      pcVar7 = (char *)0x0;
LAB_00107141:
      uVar11 = (ulong)(cfg.jobs)->i;
      if (pcVar7 == (char *)0x0) {
        if (uVar11 == 0) goto LAB_0010723f;
        pcVar7 = (cfg.jobs)->d;
      }
      else {
        pcVar9 = (cfg.jobs)->d;
        if (pcVar7 < pcVar9) {
          if (uVar11 == 0) goto LAB_0010723f;
          uVar10 = ((cfg.jobs)->icd).sz;
          uVar8 = 0;
        }
        else {
          uVar10 = ((cfg.jobs)->icd).sz;
          uVar8 = (ulong)((long)pcVar7 - (long)pcVar9) / uVar10 + 1;
          if (uVar11 <= uVar8) goto LAB_0010723f;
        }
        pcVar7 = pcVar9 + uVar10 * uVar8;
      }
      if (pcVar7 == (char *)0x0) goto LAB_0010723f;
      if ((*(int *)(pcVar7 + 0x184) == 0) && (*(int *)(pcVar7 + 0x68) != 0)) {
        syslog(3,"job %s: dependency watching disabled",*(undefined8 *)pcVar7);
      }
      goto LAB_00107141;
    }
    iVar5 = inotify_add_watch(iVar4,file,8);
    if (iVar5 != -1) {
      job = (job_t *)0x0;
LAB_00107251:
      do {
        uVar11 = (ulong)(cfg.jobs)->i;
        if (job == (job_t *)0x0) {
          if (uVar11 == 0) goto LAB_00107376;
          job = (job_t *)(cfg.jobs)->d;
        }
        else {
          pjVar1 = (job_t *)(cfg.jobs)->d;
          if (job < pjVar1) {
            if (uVar11 == 0) {
LAB_00107376:
              signal(1,(__sighandler_t)0x0);
              prctl(1,1);
              sigemptyset((sigset_t *)&hup);
              sigaddset((sigset_t *)&hup,1);
              sigprocmask(1,(sigset_t *)&hup,(sigset_t *)0x0);
              read(iVar4,&cfg.eb,0x1010);
              nanosleep((timespec *)&halfsec,(timespec *)0x0);
              _Var3 = getppid();
              kill(_Var3,1);
              exit(0);
            }
            uVar10 = ((cfg.jobs)->icd).sz;
            uVar8 = 0;
          }
          else {
            uVar10 = ((cfg.jobs)->icd).sz;
            uVar8 = (ulong)((long)job - (long)pjVar1) / uVar10 + 1;
            if (uVar11 <= uVar8) goto LAB_00107376;
          }
          job = (job_t *)((long)&pjVar1->name + uVar10 * uVar8);
        }
        if (job == (job_t *)0x0) goto LAB_00107376;
        if (job->disabled == 0) {
          pcVar7 = (char *)0x0;
LAB_001072c1:
          uVar11 = (ulong)(job->depv).i;
          if (pcVar7 == (char *)0x0) {
            if (uVar11 == 0) goto LAB_00107251;
            pcVar7 = (job->depv).d;
          }
          else {
            pcVar9 = (job->depv).d;
            if (pcVar7 < pcVar9) {
              if (uVar11 == 0) goto LAB_00107251;
              uVar10 = (job->depv).icd.sz;
              uVar8 = 0;
            }
            else {
              uVar10 = (job->depv).icd.sz;
              uVar8 = (ulong)((long)pcVar7 - (long)pcVar9) / uVar10 + 1;
              if (uVar11 <= uVar8) goto LAB_00107251;
            }
            pcVar7 = pcVar9 + uVar10 * uVar8;
          }
          if (pcVar7 == (char *)0x0) goto LAB_00107251;
          pcVar9 = fpath(job,*(char **)pcVar7);
          iVar5 = inotify_add_watch(iVar4,pcVar9,8);
          if (iVar5 == -1) {
            uVar2 = *(undefined8 *)pcVar7;
            piVar6 = __errno_location();
            pcVar9 = strerror(*piVar6);
            syslog(3,"can\'t watch %s: %s",uVar2,pcVar9);
          }
          goto LAB_001072c1;
        }
      } while( true );
    }
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    syslog(3,"can\'t watch %s: %s",file,pcVar7);
    sleep(10);
    iVar4 = -1;
    goto LAB_00107241;
  }
  return _Var3;
LAB_0010723f:
  iVar4 = 0x21;
LAB_00107241:
  exit(iVar4);
}

Assistant:

pid_t dep_monitor(char *file) {
  int rc, fd, wd, sc;
  pid_t pid;

  pid = fork();

  if (pid == (pid_t)-1) {
    syslog(LOG_ERR, "fork: %s\n", strerror(errno));
    return (pid_t)-1;
  }

  if (pid > 0) return pid;

  /* child here */
  prctl(PR_SET_NAME, "pmtr-dep");
  close_sockets(&cfg);

  /* This sub-process monitors pmtr.conf for changes, and also any
   * files explicitly named by the "depends" keyword. It is based on
   * inotify in Linux. In some situations, inotify is not available,
   * e.g., in a Linux container on a Mac host that mounts a host folder.
   * Log if inotify initialization fails but treat this as non-fatal. */
  fd = inotify_init();
  if (fd == -1) {
    syslog(LOG_ERR, "inotify_init: %s", strerror(errno)); 
    job_t *job=NULL;
    while ( (job=(job_t*)utarray_next(cfg.jobs,job))) {
      if (job->disabled) continue;
      if (utarray_len(&job->depv) > 0) {
        syslog(LOG_ERR, "job %s: dependency watching disabled", job->name);
      }
    }
    exit(PMTR_NO_RESTART); /* don't restart the dep_monitor process */
  }

  wd = inotify_add_watch(fd, file, IN_CLOSE_WRITE);
  if (wd == -1) {
    syslog(LOG_ERR, "can't watch %s: %s", file, strerror(errno)); 
    sleep(SHORT_DELAY);  /* pmtr.conf unlinked pending rewrite? */
    exit(-1);            /* parent will restart us to try again */
  }

  /* loop over jobs' dependencies, adding watch on each one. if one
   * is missing, we log the error but not fatally, because parent
   * detects this situation and disables the job */
  job_t *job=NULL;
  while ( (job=(job_t*)utarray_next(cfg.jobs,job))) {
    if (job->disabled) continue;
    char **dep=NULL;
    while ( (dep=(char**)utarray_next(&job->depv,dep))) {
      sc = inotify_add_watch(fd, fpath(job,*dep), IN_CLOSE_WRITE);
      if (sc == -1) syslog(LOG_ERR,"can't watch %s: %s", *dep, strerror(errno));
    }
  }

  /* request HUP if parent exits, unblock, action terminate */
  signal(SIGHUP, SIG_DFL);
  prctl(PR_SET_PDEATHSIG, SIGHUP);
  sigset_t hup; sigemptyset(&hup); sigaddset(&hup,SIGHUP);
  sigprocmask(SIG_UNBLOCK,&hup,NULL);

  /* block for any inotify event. when one happens, notify parent */
  rc = read(fd, &cfg.eb, sizeof(cfg.eb));
  nanosleep(&halfsec,NULL);
  kill(getppid(), SIGHUP);
  exit(0);
}